

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O2

void __thiscall
TasGrid::GridWavelet::evaluateHierarchicalFunctionsGPU
          (GridWavelet *this,double *gpu_x,int cpu_num_x,double *gpu_y)

{
  CudaWaveletData<double> *pCVar1;
  MultiIndexSet *pMVar2;
  
  loadGpuBasis<double>(this);
  pMVar2 = &(this->super_BaseCanonicalGrid).points;
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pMVar2 = &(this->super_BaseCanonicalGrid).needed;
  }
  pCVar1 = (this->gpu_cache)._M_t.
           super___uniq_ptr_impl<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::CudaWaveletData<double>_*,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
           .super__Head_base<0UL,_TasGrid::CudaWaveletData<double>_*,_false>._M_head_impl;
  TasGpu::devalpwpoly<double>
            ((this->super_BaseCanonicalGrid).acceleration,this->order,rule_wavelet,
             (this->super_BaseCanonicalGrid).num_dimensions,cpu_num_x,pMVar2->cache_num_indexes,
             gpu_x,(pCVar1->nodes).gpu_data,(pCVar1->support).gpu_data,gpu_y);
  return;
}

Assistant:

void GridWavelet::evaluateHierarchicalFunctionsGPU(const double gpu_x[], int cpu_num_x, double *gpu_y) const{
    loadGpuBasis<double>();
    TasGpu::devalpwpoly(acceleration, order, rule_wavelet, num_dimensions, cpu_num_x, getNumPoints(), gpu_x, gpu_cache->nodes.data(), gpu_cache->support.data(), gpu_y);
}